

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

WeierstrassPoint * wpoint(WeierstrassCurve *wc,size_t index)

{
  WeierstrassPoint *local_30;
  WeierstrassPoint *wp;
  mp_int *y;
  mp_int *x;
  size_t index_local;
  WeierstrassCurve *wc_local;
  
  y = (mp_int *)0x0;
  wp = (WeierstrassPoint *)0x0;
  switch(index) {
  case 0:
    break;
  case 1:
    y = mp__from_string_literal("0x12345");
    wp = (WeierstrassPoint *)mp__from_string_literal("0x3c2c799a365b53d003ef37dab65860bf80ae");
    break;
  case 2:
    y = mp__from_string_literal("0x4e1c77e3c00f7c3b15869e6a4e5f86b3ee53");
    wp = (WeierstrassPoint *)mp__from_string_literal("0x5bde01693130591400b5c9d257d8325a44a5");
    break;
  case 3:
    y = mp__from_string_literal("0xb5f0e722b2f0f7e729f55ba9f15511e3b399");
    wp = (WeierstrassPoint *)mp__from_string_literal("0x033d636b855c931cfe679f0b18db164a0d64");
    break;
  case 4:
    y = mp__from_string_literal("0xb5f0e722b2f0f7e729f55ba9f15511e3b399");
    wp = (WeierstrassPoint *)mp__from_string_literal("0xbe55d3f4b86bc38ff4b6622c418e599546ed");
    break;
  default:
    __assert_fail("false && \"only 5 example Weierstrass points defined\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                  0x32a,"WeierstrassPoint *wpoint(WeierstrassCurve *, size_t)");
  }
  if ((y == (mp_int *)0x0) || (wp == (WeierstrassPoint *)0x0)) {
    local_30 = ecc_weierstrass_point_new_identity(wc);
  }
  else {
    local_30 = ecc_weierstrass_point_new(wc,y,(mp_int *)wp);
  }
  if (y != (mp_int *)0x0) {
    mp_free(y);
  }
  if (wp != (WeierstrassPoint *)0x0) {
    mp_free((mp_int *)wp);
  }
  return local_30;
}

Assistant:

static WeierstrassPoint *wpoint(WeierstrassCurve *wc, size_t index)
{
    mp_int *x = NULL, *y = NULL;
    WeierstrassPoint *wp;
    switch (index) {
      case 0:
        break;
      case 1:
        x = MP_LITERAL(0x12345);
        y = MP_LITERAL(0x3c2c799a365b53d003ef37dab65860bf80ae);
        break;
      case 2:
        x = MP_LITERAL(0x4e1c77e3c00f7c3b15869e6a4e5f86b3ee53);
        y = MP_LITERAL(0x5bde01693130591400b5c9d257d8325a44a5);
        break;
      case 3:
        x = MP_LITERAL(0xb5f0e722b2f0f7e729f55ba9f15511e3b399);
        y = MP_LITERAL(0x033d636b855c931cfe679f0b18db164a0d64);
        break;
      case 4:
        x = MP_LITERAL(0xb5f0e722b2f0f7e729f55ba9f15511e3b399);
        y = MP_LITERAL(0xbe55d3f4b86bc38ff4b6622c418e599546ed);
        break;
      default:
        unreachable("only 5 example Weierstrass points defined");
    }
    if (x && y) {
        wp = ecc_weierstrass_point_new(wc, x, y);
    } else {
        wp = ecc_weierstrass_point_new_identity(wc);
    }
    if (x)
        mp_free(x);
    if (y)
        mp_free(y);
    return wp;
}